

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Promise<kj::Maybe<int>_> __thiscall capnp::Capability::Client::getFd(Client *this)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  Disposer *node;
  long *plVar3;
  void *pvVar4;
  long in_RSI;
  TransformPromiseNodeBase *this_00;
  Maybe<int> fd;
  OwnPromiseNode local_80;
  char local_78;
  Own<capnp::ClientHook,_std::nullptr_t> local_70;
  long *local_60;
  char local_58 [4];
  anon_union_4_1_a8c68091_for_NullableValue<int>_2 local_54;
  OwnPromiseNode local_50;
  SourceLocation local_48;
  Maybe<int> local_30;
  Maybe<int> local_28;
  
  (**(code **)(**(long **)(in_RSI + 8) + 0x28))(local_58);
  if (local_58[0] == '\x01') {
    local_28.ptr.isSet = (bool)local_58[0];
    local_28.ptr.field_1 = local_54;
    local_58[0] = '\0';
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediatePromiseNode<kj::Maybe<int>>,kj::_::PromiseDisposer,kj::Maybe<int>>
              ((PromiseDisposer *)this,&local_28);
  }
  else {
    (**(code **)(**(long **)(in_RSI + 8) + 0x18))(&local_48);
    local_78 = (char)local_48.fileName;
    if ((char)local_48.fileName == '\x01') {
      local_70.disposer = (Disposer *)local_48.function;
      (**(code **)(**(long **)(in_RSI + 8) + 0x20))(&local_70.ptr);
      kj::Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>>::
      attach<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                ((Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>> *)&local_80,&local_70);
      OVar2.ptr = local_80.ptr;
      pPVar1 = ((local_80.ptr)->super_PromiseArenaMember).arena;
      if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_80.ptr - (long)pPVar1) < 0x28) {
        pvVar4 = operator_new(0x400);
        this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_00,&local_80,
                   kj::_::
                   SimpleTransformPromiseNode<kj::Own<capnp::ClientHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:76:48)>
                   ::anon_class_1_0_00000001_for_func::operator());
        *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_006cc2c0;
        *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
      }
      else {
        ((local_80.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
        this_00 = (TransformPromiseNodeBase *)&local_80.ptr[-3].super_PromiseArenaMember.arena;
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_00,&local_80,
                   kj::_::
                   SimpleTransformPromiseNode<kj::Own<capnp::ClientHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:76:48)>
                   ::anon_class_1_0_00000001_for_func::operator());
        OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_006cc2c0;
        OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
      }
      local_48.fileName =
           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
      ;
      local_48.function = "then";
      local_48.lineNumber = 0x58b;
      local_48.columnNumber = 0x4c;
      local_50.ptr = &this_00->super_PromiseNode;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                ((PromiseDisposer *)this,&local_50,&local_48);
      OVar2.ptr = local_50.ptr;
      if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
        local_50.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
      }
      OVar2.ptr = local_80.ptr;
      if (&(local_80.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
        local_80.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
      }
      plVar3 = local_60;
      if (local_60 != (long *)0x0) {
        local_60 = (long *)0x0;
        (**(local_70.ptr)->_vptr_ClientHook)(local_70.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10))
        ;
      }
    }
    else {
      local_30.ptr.isSet = false;
      kj::_::PromiseDisposer::
      alloc<kj::_::ImmediatePromiseNode<kj::Maybe<int>>,kj::_::PromiseDisposer,kj::Maybe<int>>
                ((PromiseDisposer *)this,&local_30);
    }
    node = local_70.disposer;
    if ((local_78 == '\x01') &&
       ((PromiseArenaMember *)local_70.disposer != (PromiseArenaMember *)0x0)) {
      local_70.disposer = (Disposer *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<int>> Capability::Client::getFd() {
  auto fd = hook->getFd();
  if (fd != kj::none) {
    return fd;
  } else KJ_IF_SOME(promise, hook->whenMoreResolved()) {
    return promise.attach(hook->addRef()).then([](kj::Own<ClientHook> newHook) {
      return Client(kj::mv(newHook)).getFd();
    });
  } else {
    return kj::Maybe<int>(kj::none);
  }